

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O3

NameEquality
google::protobuf::compiler::java::anon_unknown_0::CheckNameEquality(string_view a,string_view b)

{
  Nonnull<char_*> pcVar1;
  int iVar2;
  Nullable<const_char_*> src;
  Nullable<const_char_*> src_00;
  size_t n;
  size_type __rlen;
  bool bVar3;
  string result;
  Nonnull<char_*> local_80;
  size_t local_78;
  char local_70;
  undefined7 uStack_6f;
  Nonnull<char_*> local_60;
  size_t local_58;
  char local_50;
  undefined7 uStack_4f;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> local_38;
  
  src_00 = a._M_str;
  n = a._M_len;
  src = b._M_str;
  local_78 = 0;
  local_70 = '\0';
  local_80 = &local_70;
  std::__cxx11::string::resize((ulong)&local_80,(char)a._M_len);
  absl::lts_20250127::ascii_internal::AsciiStrToUpper(local_80,src_00,n);
  local_58 = 0;
  local_50 = '\0';
  local_60 = &local_50;
  std::__cxx11::string::resize((ulong)&local_60,(char)b._M_len);
  absl::lts_20250127::ascii_internal::AsciiStrToUpper(local_60,src,b._M_len);
  pcVar1 = local_60;
  local_40 = src;
  local_38 = src_00;
  if (local_78 == local_58) {
    if (local_78 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_80,local_60,local_78);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (pcVar1 != &local_50) {
    operator_delete(pcVar1,CONCAT71(uStack_4f,local_50) + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (!bVar3) {
    return NO_MATCH;
  }
  if (n == b._M_len) {
    if (n == 0) {
      return EXACT_EQUAL;
    }
    iVar2 = bcmp(local_38,local_40,n);
    if (iVar2 == 0) {
      return EXACT_EQUAL;
    }
  }
  return EQUAL_IGNORE_CASE;
}

Assistant:

NameEquality CheckNameEquality(absl::string_view a, absl::string_view b) {
  if (absl::AsciiStrToUpper(a) == absl::AsciiStrToUpper(b)) {
    if (a == b) {
      return NameEquality::EXACT_EQUAL;
    }
    return NameEquality::EQUAL_IGNORE_CASE;
  }
  return NameEquality::NO_MATCH;
}